

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.cpp
# Opt level: O3

int shm::close(int __fd)

{
  int iVar1;
  void *__addr;
  byte bVar2;
  uint uVar3;
  undefined8 in_RAX;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  SHMException *this;
  byte in_CL;
  ulong in_RDX;
  undefined8 *in_RSI;
  undefined4 in_register_0000003c;
  char in_R8B;
  float fVar7;
  string local_50;
  
  bVar2 = in_RSI == (undefined8 *)0x0 | in_CL ^ 1;
  uVar4 = CONCAT71((int7)((ulong)in_RAX >> 8),bVar2);
  if (bVar2 == 0) {
    if ((void *)*in_RSI != (void *)0x0) {
      memset((void *)*in_RSI,0,in_RDX);
    }
  }
  else if (in_RSI == (undefined8 *)0x0) goto LAB_00104781;
  uVar4 = sysconf(0x1e);
  __addr = (void *)*in_RSI;
  if (__addr != (void *)0x0) {
    fVar7 = ceilf((float)in_RDX / (float)(long)uVar4);
    uVar5 = (ulong)(fVar7 + 1.0);
    uVar3 = munmap(__addr,((long)((fVar7 + 1.0) - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5) *
                          uVar4);
    uVar4 = (ulong)uVar3;
  }
  *in_RSI = 0;
LAB_00104781:
  if (in_R8B != '\0') {
    uVar3 = shm_unlink((char *)CONCAT44(in_register_0000003c,__fd));
    uVar4 = (ulong)uVar3;
    if (uVar3 != 0) {
      piVar6 = __errno_location();
      iVar1 = *piVar6;
      this = (SHMException *)__cxa_allocate_exception(0x28);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      if (iVar1 == 2) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Invalid file descriptor specified","");
        SHMException::SHMException(this,&local_50);
        *(undefined ***)this = &PTR__SHMException_00108d58;
        __cxa_throw(this,&TemplateSHMException<3>::typeinfo,SHMException::~SHMException);
      }
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Undefined error, check error codes","");
      SHMException::SHMException(this,&local_50);
      *(undefined ***)this = &PTR__SHMException_00108d58;
      __cxa_throw(this,&TemplateSHMException<3>::typeinfo,SHMException::~SHMException);
    }
  }
  return (int)CONCAT71((int7)(uVar4 >> 8),1);
}

Assistant:

bool
shm::close( const shm_key_t &key,
            void **ptr,
            const std::size_t nbytes,
            const bool zero,
            const bool unlink )
{
   if( zero && (ptr != nullptr) && ( *ptr != nullptr ) )
   {
      std::memset( *ptr, 0x0, nbytes );
   }
#if _USE_POSIX_SHM_ == 1
   if( ptr != nullptr )
   {
      /** get allocations size including extra dummy page **/
      const auto page_size( sysconf( _SC_PAGESIZE ) );
      const auto alloc_bytes( 
         static_cast< std::size_t >( 
            std::ceil(  
               static_cast< float >( nbytes ) / 
              static_cast< float >( page_size ) ) + 1 ) * page_size 
      );
      if( ( *ptr != nullptr ) && ( munmap( *ptr, alloc_bytes ) != shm::success ) )
      {
#if DEBUG   
         perror( "Failed to unmap shared memory, attempting to close!!" );
#endif
      }
      *ptr = nullptr;
   }
   if( unlink )
   {
      if( shm_unlink( key ) != 0 )
      {
#if USE_CPP_EXCEPTIONS==1      
         switch( errno )
         {
            case( ENOENT ):
            {
                throw invalid_key_exception( "Invalid file descriptor specified" );
            }
            break;
            default:
            {
                throw invalid_key_exception( "Undefined error, check error codes" );
            }
         }
#endif         
      }
   }
   //jump to return true if here. 
/** END POSIX MEMORY IMPL **/
#elif _USE_SYSTEMV_SHM_ == 1
/** START SYSTEMV IMPL **/
    /**
     * we could have gotten here b/c something failed and the 
     * user code is now calling close on an invalid shm seg. 
     * so let's stat first to be sure. 
     */
     const auto shmid = 
         shmget( key, sizeof(int), S_IRUSR | S_IWUSR );
     if( shmid == shm::failure ) 
     {
#if USE_CPP_EXCEPTIONS==1
        if( errno == ENOENT )
        {
            throw invalid_key_exception( "SHM key doesn't exist" );
        }
#else
        return( true );
#endif
     }
    /**
     * NOTE: This may not work quite perfectly b/c 
     * if there are M communicating pairs and you 
     * call this and only one happens to be detached,
     * then this may cause the segment to be deleted.
     */
    if(unlink /** only do this once **/  && shmctl(shmid, IPC_RMID, nullptr) == -1) 
    {
#if USE_CPP_EXCEPTIONS==1
       if( errno == EINVAL || errno == EIDRM )
       {
          throw invalid_key_exception( "Invalid SHM key" );
       }
       std::stringstream ss;
       ss << "Failed to set the SystemV memory region to exit on detach, non-fatal error (" 
         << std::strerror( errno ) << ")\n";
       throw bad_shm_alloc( ss.str() );
#else
       return( false );
#endif
    }
     //else we're here, and it exists
     if( shmdt( *ptr ) == shm::failure ) 
     {
#if USE_CPP_EXCEPTIONS==1
        std::stringstream ss;
        ss << "Failed to detach SHM with error code (" 
            <<  std::strerror( errno ) << ").";
        throw invalid_key_exception( ss.str() );
#else
        return( false );
#endif
     }

/** END SYSTEMV IMPL **/
#endif
    return( true );
}